

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::RGBUnboundedSpectrum,pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>>::
vector<pbrt::RGBUnboundedSpectrum_const*>
          (vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
           *this,RGBUnboundedSpectrum *first,RGBUnboundedSpectrum *last,
          polymorphic_allocator<pbrt::RGBUnboundedSpectrum> *alloc)

{
  undefined8 *in_RCX;
  vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
  *in_RDX;
  vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
  *in_RSI;
  polymorphic_allocator<pbrt::RGBUnboundedSpectrum> *in_RDI;
  RGBUnboundedSpectrum *iter;
  size_t i;
  vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
  *local_30;
  long local_28;
  
  in_RDI->memoryResource = (memory_resource *)*in_RCX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  local_30 = in_RSI;
  vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
  ::reserve(in_RSI,(size_t)in_RDX);
  local_28 = 0;
  for (; local_30 != in_RDX;
      local_30 = (vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
                  *)&local_30->nAlloc) {
    pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>::
    construct<pbrt::RGBUnboundedSpectrum,pbrt::RGBUnboundedSpectrum_const&>
              (in_RDI,(RGBUnboundedSpectrum *)(in_RDI[1].memoryResource + local_28 * 2),
               (RGBUnboundedSpectrum *)local_30);
    local_28 = local_28 + 1;
  }
  in_RDI[3].memoryResource = in_RDI[2].memoryResource;
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }